

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O3

int run_test_getnameinfo_basic_ip6(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  void *local_10;
  
  iVar1 = uv_ip6_addr("::1",0x50,&addr6);
  local_10 = (void *)(long)iVar1;
  if (local_10 == (void *)0x0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_getnameinfo(puVar2,&req,getnameinfo_req,(sockaddr *)&addr6,0);
    local_10 = (void *)(long)iVar1;
    if (local_10 == (void *)0x0) {
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      local_10 = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (local_10 == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0019a155;
    }
  }
  else {
    run_test_getnameinfo_basic_ip6_cold_1();
  }
  run_test_getnameinfo_basic_ip6_cold_2();
LAB_0019a155:
  handle = (uv_handle_t *)&stack0xfffffffffffffff0;
  run_test_getnameinfo_basic_ip6_cold_3();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(getnameinfo_basic_ip6) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
  
  int r;

  r = uv_ip6_addr(address_ip6, port, &addr6);
  ASSERT_OK(r);

  r = uv_getnameinfo(uv_default_loop(),
                     &req,
                     &getnameinfo_req,
                     (const struct sockaddr*)&addr6,
                     0);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}